

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueimpl.hpp
# Opt level: O0

void __thiscall
camp::detail::
ConvertVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator()(ConvertVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,undefined8 param_2)

{
  Type expected;
  BadType *__return_storage_ptr__;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  BadType local_68;
  undefined8 local_20;
  ConvertVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  ConvertVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_20 = param_2;
  local_10 = this;
  __return_storage_ptr__ = (BadType *)__cxa_allocate_exception(0x48);
  expected = mapType<std::__cxx11::string>();
  BadType::BadType(&local_68,noType,expected);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/detail/valueimpl.hpp"
             ,&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,
             "T camp::detail::ConvertVisitor<std::basic_string<char>>::operator()(NoType) const [T = std::basic_string<char>]"
             ,&local_c1);
  Error::prepare<camp::BadType>
            (__return_storage_ptr__,&local_68,(string *)local_98,0x44,(string *)local_c0);
  __cxa_throw(__return_storage_ptr__,&BadType::typeinfo,BadType::~BadType);
}

Assistant:

T operator()(NoType) const
    {
        // Error: trying to convert an empty value
        CAMP_ERROR(BadType(noType, mapType<T>()));
    }